

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_casts.cpp
# Opt level: O2

bool duckdb::ArrayToVarcharCast
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  VectorType VVar1;
  data_ptr_t pdVar2;
  bool bVar3;
  idx_t index;
  Vector *this;
  Vector *pVVar4;
  anon_union_16_2_67f50693_for_value *paVar5;
  idx_t extraout_RDX;
  idx_t extraout_RDX_00;
  idx_t extraout_RDX_01;
  idx_t extraout_RDX_02;
  uint *puVar6;
  Vector *vector;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  undefined8 __src;
  idx_t j_1;
  idx_t iVar10;
  long lVar11;
  uint *puVar12;
  idx_t j;
  idx_t iVar13;
  ulong idx;
  anon_struct_16_3_d7536bce_for_pointer aVar14;
  string_t elem;
  optional_idx local_b8;
  LogicalType local_b0;
  Vector varchar_list;
  
  VVar1 = source->vector_type;
  index = ArrayType::GetSize(&source->type);
  LogicalType::LogicalType((LogicalType *)&elem,VARCHAR);
  optional_idx::optional_idx(&local_b8,index);
  LogicalType::ARRAY(&local_b0,(LogicalType *)&elem,local_b8);
  Vector::Vector(&varchar_list,&local_b0,count);
  LogicalType::~LogicalType(&local_b0);
  LogicalType::~LogicalType((LogicalType *)&elem);
  ArrayToArrayCast(source,&varchar_list,count,parameters);
  Vector::Flatten(&varchar_list,count);
  FlatVector::VerifyFlatVector(&varchar_list);
  this = ArrayVector::GetEntry(&varchar_list);
  Vector::Flatten(this,count);
  FlatVector::VerifyFlatVector(this);
  puVar6 = (uint *)this->data;
  pdVar2 = result->data;
  lVar11 = 0;
  iVar10 = extraout_RDX;
  for (idx = 0; idx != count; idx = idx + 1) {
    if ((varchar_list.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       ((varchar_list.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[idx >> 6] >>
         (idx & 0x3f) & 1) != 0)) {
      vector = (Vector *)0x2;
      puVar12 = puVar6;
      for (iVar13 = 0; index != iVar13; iVar13 = iVar13 + 1) {
        uVar7 = (ulong)*puVar12;
        bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&(this->validity).super_TemplatedValidityMask<unsigned_long>,
                           iVar13 + lVar11);
        pVVar4 = (Vector *)&vector->field_0x2;
        if (iVar13 == 0) {
          pVVar4 = vector;
        }
        if (!bVar3) {
          uVar7 = 4;
        }
        vector = (Vector *)(&pVVar4->vector_type + uVar7);
        puVar12 = puVar12 + 4;
        iVar10 = extraout_RDX_00;
      }
      aVar14 = (anon_struct_16_3_d7536bce_for_pointer)
               StringVector::EmptyString((StringVector *)result,vector,iVar10);
      paVar5 = (anon_union_16_2_67f50693_for_value *)(pdVar2 + idx * 0x10);
      paVar5->pointer = aVar14;
      pcVar9 = aVar14.ptr;
      if (aVar14.length < 0xd) {
        pcVar9 = (paVar5->pointer).prefix;
      }
      *pcVar9 = '[';
      lVar8 = 1;
      puVar12 = puVar6;
      for (iVar10 = 0; index != iVar10; iVar10 = iVar10 + 1) {
        elem.value._0_8_ = *(undefined8 *)puVar12;
        elem.value.pointer.ptr = (char *)*(undefined8 *)(puVar12 + 2);
        if (iVar10 != 0) {
          (pcVar9 + lVar8)[0] = ',';
          (pcVar9 + lVar8)[1] = ' ';
          lVar8 = lVar8 + 2;
        }
        bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&(this->validity).super_TemplatedValidityMask<unsigned_long>,
                           iVar10 + lVar11);
        if (bVar3) {
          uVar7 = elem.value._0_8_ & 0xffffffff;
          __src = (char *)((long)&elem.value + 4);
          if (0xc < uVar7) {
            __src = elem.value.pointer.ptr;
          }
          switchD_00916250::default(pcVar9 + lVar8,(void *)__src,uVar7);
        }
        else {
          builtin_strncpy(pcVar9 + lVar8,"NULL",4);
          uVar7 = 4;
        }
        lVar8 = lVar8 + uVar7;
        puVar12 = puVar12 + 4;
      }
      pcVar9[lVar8] = ']';
      string_t::Finalize((string_t *)(pdVar2 + idx * 0x10));
      iVar10 = extraout_RDX_01;
    }
    else {
      FlatVector::SetNull(result,idx,true);
      iVar10 = extraout_RDX_02;
    }
    puVar6 = puVar6 + index * 4;
    lVar11 = lVar11 + index;
  }
  if (VVar1 == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  Vector::~Vector(&varchar_list);
  return true;
}

Assistant:

static bool ArrayToVarcharCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto is_constant = source.GetVectorType() == VectorType::CONSTANT_VECTOR;

	auto size = ArrayType::GetSize(source.GetType());
	Vector varchar_list(LogicalType::ARRAY(LogicalType::VARCHAR, size), count);
	ArrayToArrayCast(source, varchar_list, count, parameters);

	varchar_list.Flatten(count);
	auto &validity = FlatVector::Validity(varchar_list);
	auto &child = ArrayVector::GetEntry(varchar_list);

	child.Flatten(count);
	auto &child_validity = FlatVector::Validity(child);

	auto in_data = FlatVector::GetData<string_t>(child);
	auto out_data = FlatVector::GetData<string_t>(result);

	static constexpr const idx_t SEP_LENGTH = 2;
	static constexpr const idx_t NULL_LENGTH = 4;

	for (idx_t i = 0; i < count; i++) {
		if (!validity.RowIsValid(i)) {
			FlatVector::SetNull(result, i, true);
			continue;
		}

		// First pass, compute the length
		idx_t array_varchar_length = 2;
		for (idx_t j = 0; j < size; j++) {
			auto elem_idx = (i * size) + j;
			auto elem = in_data[elem_idx];
			if (j > 0) {
				array_varchar_length += SEP_LENGTH;
			}
			array_varchar_length += child_validity.RowIsValid(elem_idx) ? elem.GetSize() : NULL_LENGTH;
		}

		out_data[i] = StringVector::EmptyString(result, array_varchar_length);
		auto dataptr = out_data[i].GetDataWriteable();
		idx_t offset = 0;
		dataptr[offset++] = '[';

		// Second pass, write the actual data
		for (idx_t j = 0; j < size; j++) {
			auto elem_idx = (i * size) + j;
			auto elem = in_data[elem_idx];
			if (j > 0) {
				memcpy(dataptr + offset, ", ", SEP_LENGTH);
				offset += SEP_LENGTH;
			}
			if (child_validity.RowIsValid(elem_idx)) {
				auto len = elem.GetSize();
				memcpy(dataptr + offset, elem.GetData(), len);
				offset += len;
			} else {
				memcpy(dataptr + offset, "NULL", NULL_LENGTH);
				offset += NULL_LENGTH;
			}
		}
		dataptr[offset++] = ']';
		out_data[i].Finalize();
	}

	if (is_constant) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}

	return true;
}